

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool parse_cpu_mask(string *mask,bool (*boolmask) [512])

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  common_log *log;
  long in_RSI;
  ulong in_RDI;
  int8_t id;
  char c;
  size_t n;
  size_t i;
  size_t end_i;
  size_t num_digits;
  size_t start_i;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  byte local_7b;
  byte local_7a;
  long local_78;
  ulong local_70;
  ulong local_60;
  string local_40 [32];
  ulong local_20;
  long local_18;
  ulong local_10;
  
  local_20 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::length();
  local_7b = 0;
  if (1 < uVar2) {
    std::__cxx11::string::substr((ulong)local_40,local_10);
    local_7b = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(in_stack_ffffffffffffff76,
                                                 CONCAT15(in_stack_ffffffffffffff75,
                                                          CONCAT14(in_stack_ffffffffffffff74,
                                                                   in_stack_ffffffffffffff70)))),
                               in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_40);
  }
  if ((local_7b & 1) != 0) {
    local_20 = 2;
  }
  lVar3 = std::__cxx11::string::length();
  local_60 = lVar3 - local_20;
  if (0x80 < local_60) {
    local_60 = 0x80;
  }
  uVar2 = local_60 + local_20;
  local_70 = local_20;
  local_78 = local_60 * 4 + -1;
  do {
    if (uVar2 <= local_70) {
      return true;
    }
    pcVar4 = (char *)std::__cxx11::string::at(local_10);
    cVar1 = *pcVar4;
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((cVar1 < 'a') || ('f' < cVar1)) {
        if ((cVar1 < 'A') || ('F' < cVar1)) {
          if (-1 < common_log_verbosity_thold) {
            log = common_log_main();
            common_log_add(log,GGML_LOG_LEVEL_ERROR,"Invalid hex character \'%c\' at position %d\n",
                           (ulong)(uint)(int)cVar1,local_70 & 0xffffffff);
          }
          return false;
        }
        local_7a = cVar1 - 0x37;
      }
      else {
        local_7a = cVar1 + 0xa9;
      }
    }
    else {
      local_7a = cVar1 - 0x30;
    }
    *(bool *)(local_18 + local_78) =
         (*(byte *)(local_18 + local_78) & 1) != 0 || (local_7a & 8) != 0;
    *(bool *)(local_18 + local_78 + -1) =
         (*(byte *)(local_18 + local_78 + -1) & 1) != 0 || (local_7a & 4) != 0;
    *(bool *)(local_18 + local_78 + -2) =
         (*(byte *)(local_18 + local_78 + -2) & 1) != 0 || (local_7a & 2) != 0;
    *(bool *)(local_18 + local_78 + -3) =
         (*(byte *)(local_18 + local_78 + -3) & 1) != 0 || (local_7a & 1) != 0;
    local_70 = local_70 + 1;
    local_78 = local_78 + -4;
  } while( true );
}

Assistant:

bool parse_cpu_mask(const std::string & mask, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    // Discard potential 0x prefix
    size_t start_i = 0;
    if (mask.length() >= 2 && mask.substr(0, 2) == "0x") {
        start_i = 2;
    }

    size_t num_digits = mask.length() - start_i;
    if (num_digits > 128) num_digits = 128;

    size_t end_i = num_digits + start_i;

    for (size_t i = start_i, n = (num_digits*4 - 1); i < end_i; i++, n-=4) {
        char c = mask.at(i);
        int8_t id = c;

        if ((c >= '0' && c <= '9')) {
            id -= '0';
        } else if (c >= 'a' && c <= 'f') {
            id -= 'a' - 10;
        } else if (c >= 'A' && c <= 'F') {
            id -= 'A' - 10;
        } else {
            LOG_ERR("Invalid hex character '%c' at position %d\n", c, int32_t(i));
            return false;
        }

        boolmask[  n  ] = boolmask[  n  ] || ((id & 8) != 0);
        boolmask[n - 1] = boolmask[n - 1] || ((id & 4) != 0);
        boolmask[n - 2] = boolmask[n - 2] || ((id & 2) != 0);
        boolmask[n - 3] = boolmask[n - 3] || ((id & 1) != 0);
    }

    return true;
}